

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O0

Money * operator-(Money *__return_storage_ptr__,Money *lhs,Money *rhs)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  string local_40;
  Money *local_20;
  Money *rhs_local;
  Money *lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  lhs_local = __return_storage_ptr__;
  Money::get_currency_abi_cxx11_(&local_40,lhs);
  Money::get_currency_abi_cxx11_(&local_60,local_20);
  bVar1 = std::operator!=(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    Money::get_currency_abi_cxx11_(&local_110,rhs_local);
    std::operator+(&local_f0,"Error in operator-() - Subtraction of \'",&local_110);
    std::operator+(&local_d0,&local_f0,"\' and \'");
    Money::get_currency_abi_cxx11_(&local_130,local_20);
    std::operator+(&local_b0,&local_d0,&local_130);
    std::operator+(&local_90,&local_b0,"\' is not defined.");
    error(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  lVar2 = Money::get_cents(rhs_local);
  lVar3 = Money::get_cents(local_20);
  Money::get_currency_abi_cxx11_(&local_150,rhs_local);
  Money::Money(__return_storage_ptr__,((double)lVar2 - (double)lVar3) / 100.0,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  return __return_storage_ptr__;
}

Assistant:

Money operator-(const Money& lhs, const Money& rhs)
{
	if (lhs.get_currency() != rhs.get_currency())
	{
		error("Error in operator-() - Subtraction of '" 
			+ lhs.get_currency() + "' and '"
			+ rhs.get_currency() + "' is not defined.");
	}
	return Money{ (lhs.get_cents() - double(rhs.get_cents())) / 100.0, lhs.get_currency() };
}